

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adfa.cc
# Opt level: O0

void __thiscall re2c::DFA::reorder(DFA *this)

{
  uint uVar1;
  value_type pSVar2;
  bool bVar3;
  reference ppSVar4;
  size_type sVar5;
  reference ppSVar6;
  pair<std::_Rb_tree_const_iterator<re2c::State_*>,_bool> pVar7;
  byte local_149;
  uint local_10c;
  value_type pSStack_108;
  uint32_t i_1;
  _Base_ptr local_100;
  undefined1 local_f8;
  _Base_ptr local_f0;
  undefined1 local_e8;
  State *local_e0;
  State *q;
  value_type pSStack_d0;
  uint32_t i;
  State *s;
  undefined1 local_c0;
  undefined1 local_b8 [8];
  set<re2c::State_*,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_> done;
  queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_> todo;
  undefined1 local_28 [8];
  vector<re2c::State_*,_std::allocator<re2c::State_*>_> ord;
  DFA *this_local;
  
  ord.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<re2c::State_*,_std::allocator<re2c::State_*>_>::vector
            ((vector<re2c::State_*,_std::allocator<re2c::State_*>_> *)local_28);
  std::vector<re2c::State_*,_std::allocator<re2c::State_*>_>::reserve
            ((vector<re2c::State_*,_std::allocator<re2c::State_*>_> *)local_28,(ulong)this->nStates)
  ;
  std::queue<re2c::State*,std::deque<re2c::State*,std::allocator<re2c::State*>>>::
  queue<std::deque<re2c::State*,std::allocator<re2c::State*>>,void>
            ((queue<re2c::State*,std::deque<re2c::State*,std::allocator<re2c::State*>>> *)
             &done._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_>::push
            ((queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_> *)
             &done._M_t._M_impl.super__Rb_tree_header._M_node_count,&this->head);
  std::set<re2c::State_*,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_>::set
            ((set<re2c::State_*,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_> *)
             local_b8);
  pVar7 = std::set<re2c::State_*,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_>::insert
                    ((set<re2c::State_*,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_> *
                     )local_b8,&this->head);
  s = (State *)pVar7.first._M_node;
  local_c0 = pVar7.second;
  while (bVar3 = std::
                 queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_>::
                 empty((queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_>
                        *)&done._M_t._M_impl.super__Rb_tree_header._M_node_count),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar4 = std::queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_>
              ::front((queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_>
                       *)&done._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pSStack_d0 = *ppSVar4;
    std::queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_>::pop
              ((queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_> *)
               &done._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<re2c::State_*,_std::allocator<re2c::State_*>_>::push_back
              ((vector<re2c::State_*,_std::allocator<re2c::State_*>_> *)local_28,
               &stack0xffffffffffffff30);
    for (q._4_4_ = 0; q._4_4_ < (pSStack_d0->go).nSpans; q._4_4_ = q._4_4_ + 1) {
      local_e0 = (pSStack_d0->go).span[q._4_4_].to;
      local_149 = 0;
      if (local_e0 != (State *)0x0) {
        pVar7 = std::set<re2c::State_*,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_>::
                insert((set<re2c::State_*,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_>
                        *)local_b8,&local_e0);
        local_100 = (_Base_ptr)pVar7.first._M_node;
        local_149 = pVar7.second;
        local_f8 = local_149;
        local_f0 = local_100;
        local_e8 = local_149;
      }
      if ((local_149 & 1) != 0) {
        std::queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_>::push
                  ((queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_>
                    *)&done._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_e0);
      }
    }
  }
  uVar1 = this->nStates;
  sVar5 = std::vector<re2c::State_*,_std::allocator<re2c::State_*>_>::size
                    ((vector<re2c::State_*,_std::allocator<re2c::State_*>_> *)local_28);
  if (uVar1 != sVar5) {
    __assert_fail("nStates == ord.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/re2c/src/ir/adfa/adfa.cc"
                  ,0x76,"void re2c::DFA::reorder()");
  }
  pSStack_108 = (value_type)0x0;
  std::vector<re2c::State_*,_std::allocator<re2c::State_*>_>::push_back
            ((vector<re2c::State_*,_std::allocator<re2c::State_*>_> *)local_28,
             &stack0xfffffffffffffef8);
  for (local_10c = 0; local_10c < this->nStates; local_10c = local_10c + 1) {
    ppSVar6 = std::vector<re2c::State_*,_std::allocator<re2c::State_*>_>::operator[]
                        ((vector<re2c::State_*,_std::allocator<re2c::State_*>_> *)local_28,
                         (ulong)(local_10c + 1));
    pSVar2 = *ppSVar6;
    ppSVar6 = std::vector<re2c::State_*,_std::allocator<re2c::State_*>_>::operator[]
                        ((vector<re2c::State_*,_std::allocator<re2c::State_*>_> *)local_28,
                         (ulong)local_10c);
    (*ppSVar6)->next = pSVar2;
  }
  std::set<re2c::State_*,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_>::~set
            ((set<re2c::State_*,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_> *)
             local_b8);
  std::queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_>::~queue
            ((queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_> *)
             &done._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<re2c::State_*,_std::allocator<re2c::State_*>_>::~vector
            ((vector<re2c::State_*,_std::allocator<re2c::State_*>_> *)local_28);
  return;
}

Assistant:

void DFA::reorder()
{
	std::vector<State*> ord;
	ord.reserve(nStates);

	std::queue<State*> todo;
	todo.push(head);

	std::set<State*> done;
	done.insert(head);

	for(;!todo.empty();)
	{
		State *s = todo.front();
		todo.pop();
		ord.push_back(s);
		for(uint32_t i = 0; i < s->go.nSpans; ++i)
		{
			State *q = s->go.span[i].to;
			if(q && done.insert(q).second)
			{
				todo.push(q);
			}
		}
	}

	assert(nStates == ord.size());

	ord.push_back(NULL);
	for(uint32_t i = 0; i < nStates; ++i)
	{
		ord[i]->next = ord[i + 1];
	}
}